

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_> * __thiscall
tinyusdz::GPrim::get_primvars
          (vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>
           *__return_storage_ptr__,GPrim *this)

{
  _Rb_tree_node_base *str;
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  GeomPrimvar gprimvar;
  allocator local_3a9;
  vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_> *local_3a8;
  _Rb_tree_node_base *local_3a0;
  GPrim *local_398;
  string local_390;
  string local_370;
  GeomPrimvar local_350;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = &(this->props)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3a8 = __return_storage_ptr__;
  local_3a0 = p_Var3;
  local_398 = this;
  for (p_Var2 = (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left; p_Var2 != p_Var3
      ; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    str = p_Var2 + 1;
    std::__cxx11::string::string((string *)&local_350,"primvars:",(allocator *)&local_370);
    bVar1 = startsWith((string *)str,&local_350._name);
    std::__cxx11::string::_M_dispose();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_350,":indices",(allocator *)&local_370);
      bVar1 = endsWith((string *)str,&local_350._name);
      std::__cxx11::string::_M_dispose();
      if (!bVar1) {
        GeomPrimvar::GeomPrimvar(&local_350);
        std::__cxx11::string::string((string *)&local_390,"primvars:",&local_3a9);
        removePrefix(&local_370,(string *)str,&local_390);
        bVar1 = get_primvar(local_398,&local_370,&local_350,(string *)0x0);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        if (bVar1) {
          std::vector<tinyusdz::GeomPrimvar,_std::allocator<tinyusdz::GeomPrimvar>_>::
          emplace_back<tinyusdz::GeomPrimvar>(local_3a8,&local_350);
        }
        GeomPrimvar::~GeomPrimvar(&local_350);
        p_Var3 = local_3a0;
      }
    }
  }
  return local_3a8;
}

Assistant:

bool IsSupportedGeomPrimvarType(uint32_t tyid) {
  //
  // scalar and 1D
  //
#define SUPPORTED_TYPE_FUN(__ty)                                           \
  case value::TypeTraits<__ty>::type_id(): {                                 \
    return true;                                                           \
  }                                                                        \
  case (value::TypeTraits<__ty>::type_id() | value::TYPE_ID_1D_ARRAY_BIT): { \
    return true;                                                           \
  }

  switch (tyid) {
    APPLY_GEOMPRIVAR_TYPE(SUPPORTED_TYPE_FUN)
    default:
      return false;
  }

#undef SUPPORTED_TYPE_FUN
}